

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paths.cc
# Opt level: O3

void InstallLib(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *targets)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer pbVar4;
  long in_FS_OFFSET;
  InLocalPath file;
  InLocalPath path;
  undefined **local_c0;
  undefined1 *local_b8;
  undefined *local_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  string *local_90;
  char *local_88;
  long local_80;
  char local_78 [16];
  undefined **local_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined ***local_38;
  
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"lib","");
  local_68 = &PTR__InLocalPath_00105d08;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)local_60,local_c0,local_b8 + (long)local_c0);
  local_40 = *(undefined8 *)(in_FS_OFFSET + -8);
  local_38 = &local_68;
  *(undefined ****)(in_FS_OFFSET + -8) = local_38;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  pbVar4 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      local_c0 = &PTR__InLocalPath_00105d08;
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + pbVar4->_M_string_length);
      local_98 = *(undefined8 *)(in_FS_OFFSET + -8);
      *(string **)(in_FS_OFFSET + -8) = (string *)&local_c0;
      local_90 = (string *)&local_c0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Installing library ",0x13);
      Path::Working_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_88,local_80);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      local_c0 = &PTR__InLocalPath_00105d08;
      *(undefined8 *)(in_FS_OFFSET + -8) = local_98;
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  local_68 = &PTR__InLocalPath_00105d08;
  *(undefined8 *)(in_FS_OFFSET + -8) = local_40;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

void InstallLib(const std::vector<std::string>& targets) {
  InLocalPath path("lib");
  for (const auto& target : targets) {
    InLocalPath file(target);
    std::cerr << "Installing library " << Path::Working() << std::endl;
  }
}